

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O1

expression * dup_expression(dmr_C *C,expression *expr)

{
  undefined1 uVar1;
  position pVar2;
  symbol *psVar3;
  undefined8 uVar4;
  unsigned_long_long uVar5;
  string *psVar6;
  expression *peVar7;
  expression *peVar8;
  int iVar9;
  expression *peVar10;
  
  uVar1 = *(undefined1 *)expr;
  pVar2 = expr->pos;
  peVar10 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
  *(undefined1 *)peVar10 = uVar1;
  peVar10->pos = pVar2;
  iVar9 = expr->op;
  pVar2 = expr->pos;
  psVar3 = expr->ctype;
  uVar4 = *(undefined8 *)&expr->field_0x18;
  uVar5 = (expr->field_5).field_0.value;
  psVar6 = (expr->field_5).field_2.string;
  peVar7 = (expr->field_5).field_10.cond_false;
  peVar8 = (expr->field_5).field_14.ident_expression;
  *(undefined4 *)&peVar10->field_0x0 = *(undefined4 *)&expr->field_0x0;
  peVar10->op = iVar9;
  peVar10->pos = pVar2;
  peVar10->ctype = psVar3;
  *(undefined8 *)&peVar10->field_0x18 = uVar4;
  (peVar10->field_5).field_0.value = uVar5;
  (peVar10->field_5).field_2.string = psVar6;
  (peVar10->field_5).field_10.cond_false = peVar7;
  (peVar10->field_5).field_14.ident_expression = peVar8;
  return peVar10;
}

Assistant:

static struct expression * dup_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression *dup = dmrC_alloc_expression(C, expr->pos, expr->type);
	*dup = *expr;
	return dup;
}